

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SDMMCSimulationDataGenerator.cpp
# Opt level: O0

void __thiscall
SDMMCSimulationDataGenerator::CreateCommand
          (SDMMCSimulationDataGenerator *this,uint index,unsigned_long arg)

{
  SimulationChannelDescriptor *pSVar1;
  int iVar2;
  int local_50;
  U8 local_49;
  int i_1;
  U8 crc;
  U8 crc_data [5];
  int local_34;
  BitExtractor local_30 [4];
  int i;
  BitExtractor bits;
  U64 data;
  unsigned_long arg_local;
  uint index_local;
  SDMMCSimulationDataGenerator *this_local;
  
  _bits = (ulong)index << 0x20 | 0x4000000000 | arg;
  iVar2 = SimulationChannelDescriptor::GetCurrentBitState();
  if (iVar2 != 1) {
    SimulationChannelDescriptor::Transition();
    ClockGenerator::AdvanceByHalfPeriod(0.5);
    SimulationChannelDescriptorGroup::AdvanceAll((int)this + 0x18);
  }
  BitExtractor::BitExtractor(local_30,_bits,MsbFirst,0x28);
  for (local_34 = 0; local_34 < 0x28; local_34 = local_34 + 1) {
    pSVar1 = this->mCommand;
    BitExtractor::GetNextBit();
    SimulationChannelDescriptor::TransitionIfNeeded((BitState)pSVar1);
    CreateClockPeriod(this);
  }
  arg_local._4_1_ = (char)index;
  local_49 = arg_local._4_1_ + '@';
  data._3_1_ = (undefined1)(arg >> 0x18);
  i_1._0_1_ = data._3_1_;
  data._2_1_ = (undefined1)(arg >> 0x10);
  i_1._1_1_ = data._2_1_;
  data._1_1_ = (undefined1)(arg >> 8);
  i_1._2_1_ = data._1_1_;
  data._0_1_ = (undefined1)arg;
  i_1._3_1_ = (undefined1)data;
  SDMMCHelpers::crc7(&local_49,5);
  for (local_50 = 0; local_50 < 7; local_50 = local_50 + 1) {
    SimulationChannelDescriptor::TransitionIfNeeded((BitState)this->mCommand);
    CreateClockPeriod(this);
  }
  SimulationChannelDescriptor::TransitionIfNeeded((BitState)this->mCommand);
  CreateClockPeriod(this);
  BitExtractor::~BitExtractor(local_30);
  return;
}

Assistant:

void SDMMCSimulationDataGenerator::CreateCommand(unsigned int index, unsigned long arg)
{
	U64 data =
		(0ull       << 39) | /* start bit */
		(1ull       << 38) | /* transmission bit: host */
		((U64)index << 32) | /* command index */
		((U64)arg   <<  0);  /* command argument */

	/* make sure we continue with clock as high */
	if (mClock->GetCurrentBitState() != BIT_HIGH) {
		mClock->Transition();
		mChannels.AdvanceAll(mClockGenerator.AdvanceByHalfPeriod(.5));
	}

	BitExtractor bits(data, AnalyzerEnums::MsbFirst, 40);

	for (int i = 0; i < 40; i++) {
		mCommand->TransitionIfNeeded(bits.GetNextBit());
		CreateClockPeriod();
	}

	U8 crc_data[5];

	crc_data[0] = 0x40 + (U8)index;
	crc_data[1] = arg >> 24;
	crc_data[2] = arg >> 16;
	crc_data[3] = arg >>  8;
	crc_data[4] = arg;

	U8 crc = SDMMCHelpers::crc7(crc_data, 5);

	for (int i = 0; i < 7; i++) {
		crc <<= 1;

		mCommand->TransitionIfNeeded(crc & 0x80 ? BIT_HIGH : BIT_LOW);
		CreateClockPeriod();
	}

	/* stop bit */
	mCommand->TransitionIfNeeded(BIT_HIGH);
	CreateClockPeriod();
}